

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

char __thiscall FileLexer::supply(FileLexer *this)

{
  unsigned_long_long *puVar1;
  int iVar2;
  
  if (this->done != false) {
    return '\0';
  }
  puVar1 = &(this->super_Lexer).position;
  *puVar1 = *puVar1 + 1;
  iVar2 = std::istream::get();
  if (iVar2 == -1) {
    this->done = true;
    iVar2 = 0;
  }
  return (char)iVar2;
}

Assistant:

auto FileLexer::supply() -> char {
    if (done)
        return '\0';

    position++;
    auto data = stream.get();
    if (data == -1) {
        done = true;
        return '\0';
    }

    return data;
}